

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

uint32_t __thiscall
asmjit::v1_14::CodeHolder::labelIdByName
          (CodeHolder *this,char *name,size_t nameSize,uint32_t parentId)

{
  LabelEntry *pLVar1;
  uint in_ECX;
  size_t in_RDX;
  char *in_RSI;
  LabelEntry *le;
  uint32_t hashCode;
  uint32_t local_64;
  LabelByName *in_stack_ffffffffffffffb8;
  ZoneHash<asmjit::v1_14::LabelEntry> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  uint32_t local_30;
  uint32_t local_c;
  
  local_30 = CodeHolder_hashNameAndGetSize
                       (in_stack_ffffffffffffffc8,(size_t *)in_stack_ffffffffffffffc0);
  if (in_RDX == 0) {
    local_c = 0;
  }
  else {
    if (in_ECX != 0xffffffff) {
      local_30 = in_ECX ^ local_30;
    }
    LabelByName::LabelByName((LabelByName *)&stack0xffffffffffffffb0,in_RSI,in_RDX,local_30,in_ECX);
    pLVar1 = ZoneHash<asmjit::v1_14::LabelEntry>::get<asmjit::v1_14::LabelByName>
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (pLVar1 == (LabelEntry *)0x0) {
      local_64 = 0xffffffff;
    }
    else {
      local_64 = *(uint32_t *)&pLVar1->field_0xc;
    }
    local_c = local_64;
  }
  return local_c;
}

Assistant:

uint32_t CodeHolder::labelIdByName(const char* name, size_t nameSize, uint32_t parentId) noexcept {
  uint32_t hashCode = CodeHolder_hashNameAndGetSize(name, nameSize);
  if (ASMJIT_UNLIKELY(!nameSize))
    return 0;

  if (parentId != Globals::kInvalidId)
    hashCode ^= parentId;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameSize, hashCode, parentId));
  return le ? le->id() : uint32_t(Globals::kInvalidId);
}